

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O2

void __thiscall
OptionParser::parseQualOption(OptionParser *this,string *s2,string *s3,Network *network)

{
  Options *this_00;
  int iVar1;
  InputError *pIVar2;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  string s2U;
  string s3U;
  
  Utilities::upperCase((string *)local_78,s2);
  iVar1 = Utilities::findFullMatch((string *)local_78,epanetQualKeywords);
  this_00 = &network->options;
  if (iVar1 < 0) {
    std::__cxx11::string::string
              ((string *)(s2U.field_2._M_local_buf + 8),"CHEMICAL",
               (allocator *)(s3U.field_2._M_local_buf + 0xf));
    Options::setOption(this_00,QUAL_MODEL,(string *)((long)&s2U.field_2 + 8));
    std::__cxx11::string::~string((string *)(s2U.field_2._M_local_buf + 8));
    Options::setOption(this_00,QUAL_NAME,s2);
    iVar1 = 3;
    Options::setOption(this_00,QUAL_TYPE,3);
  }
  else {
    Options::setOption(this_00,QUAL_MODEL,(string *)local_78);
    Options::setOption(this_00,QUAL_NAME,(string *)local_78);
    Options::setOption(this_00,QUAL_TYPE,iVar1);
  }
  Options::setOption(this_00,QUAL_UNITS,iVar1);
  iVar1 = (network->options).indexOptions[8];
  if (iVar1 == 2) {
    if (s3->_M_string_length == 0) {
      pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_d8,(string *)s3);
      InputError::InputError(pIVar2,5,&local_d8);
      __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
    }
    iVar1 = Network::indexOf(network,NODE,s3);
    if (iVar1 < 0) {
      pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_b8,(string *)s3);
      InputError::InputError(pIVar2,5,&local_b8);
      __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
    }
    Options::setOption(this_00,TRACE_NODE,iVar1);
    Options::setOption(this_00,TRACE_NODE_NAME,s3);
    iVar1 = (network->options).indexOptions[8];
  }
  if ((iVar1 == 3) && (s3->_M_string_length != 0)) {
    Utilities::upperCase((string *)((long)&s2U.field_2 + 8),s3);
    iVar1 = std::__cxx11::string::compare(s2U.field_2._M_local_buf + 8);
    if (iVar1 == 0) {
      iVar1 = 3;
    }
    else {
      iVar1 = std::__cxx11::string::compare(s2U.field_2._M_local_buf + 8);
      if (iVar1 != 0) {
        pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_98,(string *)s3);
        InputError::InputError(pIVar2,3,&local_98);
        __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
      }
      iVar1 = 4;
    }
    Options::setOption(this_00,QUAL_UNITS,iVar1);
    std::__cxx11::string::~string((string *)(s2U.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void OptionParser::parseQualOption(const string& s2, const string& s3,
                                   Network* network)
{
    string s2U = Utilities::upperCase(s2);
    int i = Utilities::findFullMatch(s2U, epanetQualKeywords);
    if ( i >= 0 )
    {
        network->options.setOption(Options::QUAL_MODEL, s2U);
        network->options.setOption(Options::QUAL_NAME, s2U);
        network->options.setOption(Options::QUAL_TYPE, i);
        network->options.setOption(Options::QUAL_UNITS, i);
    }
    else
    {
        network->options.setOption(Options::QUAL_MODEL, w_CHEMICAL);
        network->options.setOption(Options::QUAL_NAME, s2);
        network->options.setOption(Options::QUAL_TYPE, Options::CHEM);
        network->options.setOption(Options::QUAL_UNITS, Options::MGL);
    }

    if (network->option(Options::QUAL_TYPE) == Options::TRACE)
    {
        if (s3.empty()) throw InputError(InputError::UNDEFINED_OBJECT, s3);
        int nodeIndex = network->indexOf(Element::NODE, s3);
        if (nodeIndex < 0) throw InputError(InputError::UNDEFINED_OBJECT, s3);
        network->options.setOption(Options::TRACE_NODE, nodeIndex);
        network->options.setOption(Options::TRACE_NODE_NAME, s3);
    }

    if (network->option(Options::QUAL_TYPE) == Options::CHEM && !s3.empty())
    {
        string s3U = Utilities::upperCase(s3);
        if (s3U.compare("MG/L") == 0)
            network->options.setOption(Options::QUAL_UNITS, Options::MGL);
        else if (s3U.compare("UG/L") == 0)
            network->options.setOption(Options::QUAL_UNITS, Options::UGL);
        else throw InputError(InputError::INVALID_KEYWORD, s3);
    }
}